

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestService_Stub::Foo
          (TestService_Stub *this,RpcController *controller,FooRequest *request,
          FooResponse *response,Closure *done)

{
  RpcChannel *pRVar1;
  ServiceDescriptor *apSVar2 [1];
  Nonnull<const_char_*> pcVar3;
  
  pRVar1 = this->channel_;
  google::protobuf::internal::AssignDescriptors
            (&descriptor_table_google_2fprotobuf_2funittest_2eproto);
  apSVar2[0] = file_level_service_descriptors_google_2fprotobuf_2funittest_2eproto[0];
  if ((long)file_level_service_descriptors_google_2fprotobuf_2funittest_2eproto[0]->method_count_ <
      1) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)file_level_service_descriptors_google_2fprotobuf_2funittest_2eproto
                                [0]->method_count_,"index < method_count()");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    (*pRVar1->_vptr_RpcChannel[2])(pRVar1,apSVar2[0]->methods_,controller,request,response,done);
    return;
  }
  Foo();
}

Assistant:

void TestService_Stub::Foo(
    ::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
    const ::proto2_unittest::FooRequest* PROTOBUF_NONNULL request, ::proto2_unittest::FooResponse* PROTOBUF_NONNULL response,
    ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  channel_->CallMethod(descriptor()->method(0), controller,
                       request, response, done);
}